

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateHeader
          (Generator *this,GeneratorOptions *options,FileDescriptor *file,Printer *printer)

{
  FileDescriptor *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000028;
  Printer *in_stack_00000030;
  char *in_stack_00000038;
  Printer *in_stack_00000040;
  
  if (in_RDX != (FileDescriptor *)0x0) {
    FileDescriptor::name_abi_cxx11_(in_RDX);
    io::Printer::Print<char[9],std::__cxx11::string>
              (in_stack_00000040,in_stack_00000038,&in_stack_00000030->variable_delimiter_,
               in_stack_00000028);
  }
  io::Printer::Print<>(in_stack_00000030,(char *)in_stack_00000028);
  return;
}

Assistant:

void Generator::GenerateHeader(const GeneratorOptions& options,
                               const FileDescriptor* file,
                               io::Printer* printer) const {
  if (file != nullptr) {
    printer->Print("// source: $filename$\n", "filename", file->name());
  }
  printer->Print(
      "/**\n"
      " * @fileoverview\n"
      " * @enhanceable\n"
      " * @suppress {messageConventions} JS Compiler reports an "
      "error if a variable or\n"
      " *     field starts with 'MSG_' and isn't a translatable "
      "message.\n"
      " * @public\n"
      " */\n"
      "// GENERATED CODE -- DO NOT EDIT!\n"
      "\n");
}